

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void colmajor_to_rowmajor<double,int>
               (double *Xc,int *Xc_ind,int *Xc_indptr,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *Xr,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_ind,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_indptr)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  ulong in_RCX;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  ulong in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  size_t row;
  size_t ix_2;
  size_t curr_n;
  size_t curr_row;
  size_t ix_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> argsorted_indices;
  int ix;
  size_t col;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_indices;
  size_t nnz;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea8;
  unsigned_long in_stack_fffffffffffffeb0;
  value_type vVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed0;
  ulong local_e8;
  size_type local_e0;
  value_type local_d8;
  value_type local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  int local_74;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ulong local_38;
  vector<double,_std::allocator<double>_> *local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  vector<double,_std::allocator<double>_> *local_10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  local_38 = (ulong)*(int *)(in_RDX + in_R8 * 4);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1dc032);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8._M_current,
             (allocator_type *)in_stack_fffffffffffffec0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1dc058);
  for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
    for (local_74 = *(int *)(local_18 + local_70 * 4);
        local_74 < *(int *)(local_18 + 4 + local_70 * 4); local_74 = local_74 + 1) {
      iVar1 = *(int *)((long)&(local_10->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start + (long)local_74 * 4);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,(long)local_74);
      *pvVar2 = (long)iVar1;
    }
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1dc15a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8._M_current,
             (allocator_type *)in_stack_fffffffffffffec0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1dc180);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffea8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffea8);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffea8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffea8);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,colmajor_to_rowmajor<double,int>(double_const*,int_const*,int_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (anon_class_8_1_37759ca2)in_stack_fffffffffffffec0._M_current);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current,
             (size_type)in_stack_fffffffffffffec8._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8._M_current);
  for (local_c8 = 0; local_c8 < local_38; local_c8 = local_c8 + 1) {
    in_stack_fffffffffffffec0._M_current = (unsigned_long *)local_8;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_c8);
    in_stack_fffffffffffffec8._M_current =
         (&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            in_stack_fffffffffffffec0._M_current)->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start)[*pvVar2];
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_c8);
    *pvVar3 = (value_type)in_stack_fffffffffffffec8._M_current;
    in_stack_fffffffffffffed0._M_current = (unsigned_long *)local_10;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_c8);
    iVar1 = *(int *)((long)&(((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffed0._M_current)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + *pvVar2 * 4);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000008,local_c8);
    *pvVar2 = (long)iVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8._M_current);
  local_d0 = 0;
  local_d8 = 0;
  for (local_e0 = 0; local_e0 < local_38; local_e0 = local_e0 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_e0);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_50,*pvVar2);
    if (*pvVar2 == local_d0) {
      local_d8 = local_d8 + 1;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,local_d0 + 1);
      *pvVar2 = local_d8;
      local_d8 = 0;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_90,local_e0);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,*pvVar2);
      local_d0 = *pvVar2;
    }
  }
  for (local_e8 = 1; local_e8 < local_20; local_e8 = local_e8 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000010,local_e8);
    vVar4 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000010,local_e8 + 1);
    *pvVar2 = vVar4 + *pvVar2;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffec0._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffec0._M_current);
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                          size_t nrows, size_t ncols,
                          std::vector<double> &Xr, std::vector<size_t> &Xr_ind, std::vector<size_t> &Xr_indptr)
{
    /* First convert to COO */
    size_t nnz = Xc_indptr[ncols];
    std::vector<size_t> row_indices(nnz);
    for (size_t col = 0; col < ncols; col++)
    {
        for (sparse_ix ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
        {
            row_indices[ix] = Xc_ind[ix];
        }
    }

    /* Then copy the data argsorted by rows */
    std::vector<size_t> argsorted_indices(nnz);
    std::iota(argsorted_indices.begin(), argsorted_indices.end(), (size_t)0);
    std::stable_sort(argsorted_indices.begin(), argsorted_indices.end(),
                     [&row_indices](const size_t a, const size_t b)
                     {return row_indices[a] < row_indices[b];});
    Xr.resize(nnz);
    Xr_ind.resize(nnz);
    for (size_t ix = 0; ix < nnz; ix++)
    {
        Xr[ix] = Xc[argsorted_indices[ix]];
        Xr_ind[ix] = Xc_ind[argsorted_indices[ix]];
    }

    /* Now build the index pointer */
    Xr_indptr.resize(nrows+1);
    size_t curr_row = 0;
    size_t curr_n = 0;
    for (size_t ix = 0; ix < nnz; ix++)
    {
        if (row_indices[argsorted_indices[ix]] != curr_row)
        {
            Xr_indptr[curr_row+1] = curr_n;
            curr_n = 0;
            curr_row = row_indices[argsorted_indices[ix]];
        }

        else
        {
            curr_n++;
        }
    }
    for (size_t row = 1; row < nrows; row++)
        Xr_indptr[row+1] += Xr_indptr[row];
}